

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

char * Extra_FileRead2(FILE *pFile,FILE *pFile2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *__ptr;
  int RetValue;
  int nSize2;
  int nSize;
  char *pBuffer;
  FILE *pFile2_local;
  FILE *pFile_local;
  
  fseek((FILE *)pFile,0,2);
  lVar3 = ftell((FILE *)pFile);
  iVar1 = (int)lVar3;
  rewind((FILE *)pFile);
  fseek((FILE *)pFile2,0,2);
  lVar3 = ftell((FILE *)pFile2);
  iVar2 = (int)lVar3;
  rewind((FILE *)pFile2);
  __ptr = (char *)malloc((long)(iVar1 + iVar2 + 3));
  fread(__ptr,(long)iVar1,1,(FILE *)pFile);
  fread(__ptr + iVar1,(long)iVar2,1,(FILE *)pFile2);
  __ptr[iVar1 + iVar2] = '\n';
  __ptr[iVar1 + iVar2 + 1] = '\0';
  return __ptr;
}

Assistant:

char * Extra_FileRead2( FILE * pFile, FILE * pFile2 )
{
    char * pBuffer;
    int nSize, nSize2;
    int RetValue;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nSize = ftell( pFile );  
    rewind( pFile ); 
    // get the file size, in bytes
    fseek( pFile2, 0, SEEK_END );  
    nSize2 = ftell( pFile2 );  
    rewind( pFile2 ); 
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nSize + nSize2 + 3 );
    RetValue = fread( pBuffer,         nSize,  1, pFile );
    RetValue = fread( pBuffer + nSize, nSize2, 1, pFile2 );
    // terminate the string with '\0'
    pBuffer[ nSize + nSize2 + 0] = '\n';
    pBuffer[ nSize + nSize2 + 1] = '\0';
    return pBuffer;
}